

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<float,_10>::TPZManVector(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  float *pfVar4;
  
  (this->super_TPZVec<float>).fStore = (float *)0x0;
  (this->super_TPZVec<float>).fNElements = 0;
  (this->super_TPZVec<float>).fNAlloc = 0;
  (this->super_TPZVec<float>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841c20;
  lVar1 = (rval->super_TPZVec<float>).fNElements;
  if (lVar1 < 0xb) {
    if (lVar1 < 1) {
      uVar2 = 0;
    }
    else {
      lVar3 = 0;
      do {
        this->fExtAlloc[lVar3] = rval->fExtAlloc[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
      uVar2 = (uint)lVar1;
    }
    if (uVar2 < 10) {
      memset(this->fExtAlloc + uVar2,0,(ulong)(9 - uVar2) * 4 + 4);
    }
    pfVar4 = this->fExtAlloc;
    lVar3 = 0;
  }
  else {
    pfVar4 = (rval->super_TPZVec<float>).fStore;
    lVar3 = lVar1;
  }
  (this->super_TPZVec<float>).fStore = pfVar4;
  (this->super_TPZVec<float>).fNElements = lVar1;
  (this->super_TPZVec<float>).fNAlloc = lVar3;
  (rval->super_TPZVec<float>).fStore = (float *)0x0;
  (rval->super_TPZVec<float>).fNElements = 0;
  (rval->super_TPZVec<float>).fNAlloc = 0;
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(TPZManVector< T, NumExtAlloc >&& rval) {

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (auto size = rval.NElements();size <= NumExtAlloc){
        //we need to copy, unfortunately
        int i = 0;
        for(; i < size; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else {// The size requested is bigger than the size already provided.
        this->fStore = rval.fStore;
        this->fNElements = size;
        this->fNAlloc = size;
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
}